

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O2

size_t i2p_dest_sigsize(i2p_privkeybuf *priv)

{
  size_t sVar1;
  
  sVar1 = 0x40;
  if (priv->sigtype != 7) {
    sVar1 = (ulong)(priv->sigtype == 0) << 7;
  }
  return sVar1;
}

Assistant:

size_t i2p_dest_sigsize(struct i2p_privkeybuf * priv)
{
  switch(priv->sigtype)
  {
  case EDDSA_KEYTYPE:
    return 64;
  case DSA_KEYTYPE:
    return 128;
  default:
    return 0;
  }
}